

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O0

void __thiscall dg::SubgraphNode<dg::pta::PSNode>::isolate(SubgraphNode<dg::pta::PSNode> *this)

{
  bool bVar1;
  reference ppPVar2;
  PSNode *in_RDI;
  PSNode *succ_1;
  iterator __end0_5;
  iterator __begin0_5;
  NodesVec *__range3_2;
  PSNode *pred_1;
  iterator __end0_4;
  iterator __begin0_4;
  NodesVec *__range2_2;
  PSNode *n_1;
  iterator __end0_3;
  iterator __begin0_3;
  NodesVec *__range3_1;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> new_preds;
  PSNode *succ;
  iterator __end0_2;
  iterator __begin0_2;
  NodesVec *__range2_1;
  PSNode *n;
  iterator __end0_1;
  iterator __begin0_1;
  NodesVec *__range3;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> new_succs;
  PSNode *pred;
  iterator __end0;
  iterator __begin0;
  NodesVec *__range2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_fffffffffffffed8;
  PSNode *in_stack_fffffffffffffee0;
  PSNode *in_stack_fffffffffffffee8;
  PSNode *in_stack_fffffffffffffef0;
  PSNode *local_108;
  size_type in_stack_ffffffffffffff08;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffff10;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_e8;
  uint *local_e0;
  PSNode *local_d8;
  PSNode **local_d0;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_c8;
  pointer *local_c0;
  PSNode *local_b8;
  PSNode **local_b0;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_a8;
  NodesVec *local_a0;
  PSNode *local_80;
  PSNode **local_78;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_70;
  uint *local_68;
  PSNode *local_60;
  PSNode **local_58;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_50;
  NodesVec *local_48;
  PSNode *local_28;
  PSNode **local_20;
  __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_18;
  pointer *local_10;
  
  local_10 = &(in_RDI->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_18._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_fffffffffffffed8);
  local_20 = (PSNode **)
             std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                       (in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppPVar2;
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15d755);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::size
              (&(local_28->super_SubgraphNode<dg::pta::PSNode>)._successors);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_48 = &(local_28->super_SubgraphNode<dg::pta::PSNode>)._successors;
    local_50._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   (in_stack_fffffffffffffed8);
    local_58 = (PSNode **)
               std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                         (in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      ppPVar2 = __gnu_cxx::
                __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                ::operator*(&local_50);
      in_stack_fffffffffffffef0 = *ppPVar2;
      local_108 = (PSNode *)0x0;
      if (in_stack_fffffffffffffef0 != (PSNode *)0x0) {
        local_108 = (PSNode *)&in_stack_fffffffffffffef0->super_SubgraphNode<dg::pta::PSNode>;
      }
      local_60 = in_stack_fffffffffffffef0;
      if (local_108 != in_RDI) {
        std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                  ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                   in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
      }
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_50);
    }
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::swap
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffef0,
               (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffee8);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffef0);
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_18);
  }
  local_68 = &(in_RDI->super_SubgraphNode<dg::pta::PSNode>).scc_id;
  local_70._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_fffffffffffffed8);
  local_78 = (PSNode **)
             std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                       (in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_70);
    local_80 = *ppPVar2;
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15d909);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::size
              (&(local_80->super_SubgraphNode<dg::pta::PSNode>)._predecessors);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_a0 = &(local_80->super_SubgraphNode<dg::pta::PSNode>)._predecessors;
    local_a8._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   (in_stack_fffffffffffffed8);
    local_b0 = (PSNode **)
               std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                         (in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      ppPVar2 = __gnu_cxx::
                __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                ::operator*(&local_a8);
      in_stack_fffffffffffffee0 = *ppPVar2;
      in_stack_fffffffffffffee8 = (PSNode *)0x0;
      if (in_stack_fffffffffffffee0 != (PSNode *)0x0) {
        in_stack_fffffffffffffee8 =
             (PSNode *)&in_stack_fffffffffffffee0->super_SubgraphNode<dg::pta::PSNode>;
      }
      local_b8 = in_stack_fffffffffffffee0;
      if (in_stack_fffffffffffffee8 != in_RDI) {
        std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                  ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                   in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
      }
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_a8);
    }
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::swap
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffef0,
               (vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffee8);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffef0);
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_70);
  }
  local_c0 = &(in_RDI->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_c8._M_current =
       (PSNode **)
       std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                 (in_stack_fffffffffffffed8);
  local_d0 = (PSNode **)
             std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                       (in_stack_fffffffffffffed8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        *)in_stack_fffffffffffffed8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator*(&local_c8);
    local_d8 = *ppPVar2;
    local_e0 = &(in_RDI->super_SubgraphNode<dg::pta::PSNode>).scc_id;
    local_e8._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   (in_stack_fffffffffffffed8);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
              (in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator*(&local_e8);
      addSuccessor((SubgraphNode<dg::pta::PSNode> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_e8);
    }
    __gnu_cxx::
    __normal_iterator<dg::pta::PSNode_**,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
    ::operator++(&local_c8);
  }
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15db1a);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x15db28);
  return;
}

Assistant:

void isolate() {
        // Remove this node from successors of the predecessors
        for (NodeT *pred : _predecessors) {
            std::vector<NodeT *> new_succs;
            new_succs.reserve(pred->_successors.size());

            for (NodeT *n : pred->_successors) {
                if (n != this)
                    new_succs.push_back(n);
            }

            new_succs.swap(pred->_successors);
        }

        // remove this nodes from successors' predecessors
        for (NodeT *succ : _successors) {
            std::vector<NodeT *> new_preds;
            new_preds.reserve(succ->_predecessors.size());

            for (NodeT *n : succ->_predecessors) {
                if (n != this)
                    new_preds.push_back(n);
            }

            new_preds.swap(succ->_predecessors);
        }

        // Take every predecessor and connect it to every successor.
        for (NodeT *pred : _predecessors) {
            for (NodeT *succ : _successors) {
                assert(succ != this && "Self-loop");
                pred->addSuccessor(succ);
            }
        }

        _successors.clear();
        _predecessors.clear();
    }